

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::BufferTestUtil::IndexArrayVerifier::~IndexArrayVerifier(IndexArrayVerifier *this)

{
  IndexArrayVerifier *this_local;
  
  ~IndexArrayVerifier(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

IndexArrayVerifier::~IndexArrayVerifier (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_vao)			gl.deleteVertexArrays(1, &m_vao);
	if (m_positionBuf)	gl.deleteBuffers(1, &m_positionBuf);
	if (m_colorBuf)		gl.deleteBuffers(1, &m_colorBuf);

	delete m_program;
}